

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_strings.cpp
# Opt level: O0

char * __thiscall
pstore::exchange::export_ns::string_mapping::index(string_mapping *this,char *__s,int __c)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_pstore::address,_unsigned_long>,_true> local_30;
  key_type local_28;
  _Node_iterator_base<std::pair<const_pstore::address,_unsigned_long>,_true> local_20;
  const_iterator pos;
  string_mapping *this_local;
  typed_address<pstore::indirect_string> addr_local;
  
  pos.super__Node_iterator_base<std::pair<const_pstore::address,_unsigned_long>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_pstore::address,_unsigned_long>,_true>)
       (_Node_iterator_base<std::pair<const_pstore::address,_unsigned_long>,_true>)this;
  this_local = (string_mapping *)__s;
  local_28.a_ = (value_type)
                typed_address<pstore::indirect_string>::to_address
                          ((typed_address<pstore::indirect_string> *)&this_local);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<pstore::address,_unsigned_long,_std::hash<pstore::address>,_std::equal_to<pstore::address>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>_>
       ::find(&this->strings_,&local_28);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<pstore::address,_unsigned_long,_std::hash<pstore::address>,_std::equal_to<pstore::address>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>_>
       ::end(&this->strings_);
  bVar1 = std::__detail::operator!=(&local_20,&local_30);
  if (!bVar1) {
    assert_failed("pos != strings_.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_strings.cpp"
                  ,0x2b);
  }
  pvVar2 = std::__detail::
           _Node_const_iterator<std::pair<const_pstore::address,_unsigned_long>,_false,_true>::
           operator->((_Node_const_iterator<std::pair<const_pstore::address,_unsigned_long>,_false,_true>
                       *)&local_20);
  return (char *)pvVar2->second;
}

Assistant:

std::uint64_t string_mapping::index (typed_address<indirect_string> const addr) const {
                auto const pos = strings_.find (addr.to_address ());
                PSTORE_ASSERT (pos != strings_.end ());
                return pos->second;
            }